

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

vm_obj_id_t CVmObjByteArray::create_from_bytes(int in_root_set,char *buf,size_t len)

{
  vm_obj_id_t vVar1;
  
  vVar1 = create(in_root_set,len);
  copy_from_buf((CVmObjByteArray *)(G_obj_table_X.pages_[vVar1 >> 0xc] + (vVar1 & 0xfff)),
                (uchar *)buf,1,len);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_bytes(
    VMG_ int in_root_set, const char *buf, size_t len)
{
    /* allocate the array */
    vm_obj_id_t id = create(vmg_ in_root_set, len);
    CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ id);

    /* copy the bytes into the array */
    arr->cons_copy_from_buf((const unsigned char *)buf, 1, len);

    /* return the new array's object ID */
    return id;
}